

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLin>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLin>
                 *this,GetterXsYs<int> *getter1,GetterXsYs<int> *getter2,
                TransformerLogLin *transformer,ImU32 col)

{
  double dVar1;
  int iVar2;
  ImPlotPlot *pIVar3;
  GetterXsYs<int> *pGVar4;
  TransformerLogLin *pTVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  double dVar8;
  ImPlotContext *pIVar9;
  int iVar10;
  long lVar11;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar2 = getter1->Count;
  iVar10 = getter2->Count;
  if (iVar2 < getter2->Count) {
    iVar10 = iVar2;
  }
  this->Prims = iVar10 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar9 = GImPlot;
  (this->P12).y = 0.0;
  lVar11 = (long)((getter1->Offset % iVar2 + iVar2) % iVar2) * (long)getter1->Stride;
  iVar2 = *(int *)((long)getter1->Ys + lVar11);
  dVar8 = log10((double)*(int *)((long)getter1->Xs + lVar11) /
                (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar3 = pIVar9->CurrentPlot;
  dVar1 = (pIVar3->XAxis).Range.Min;
  iVar10 = transformer->YAxis;
  IVar6.y = (float)(((double)iVar2 - pIVar3->YAxis[iVar10].Range.Min) * pIVar9->My[iVar10] +
                   (double)pIVar9->PixelRange[iVar10].Min.y);
  IVar6.x = (float)((((double)(float)(dVar8 / pIVar9->LogDenX) * ((pIVar3->XAxis).Range.Max - dVar1)
                     + dVar1) - dVar1) * pIVar9->Mx + (double)pIVar9->PixelRange[iVar10].Min.x);
  this->P11 = IVar6;
  pIVar9 = GImPlot;
  pGVar4 = this->Getter2;
  pTVar5 = this->Transformer;
  iVar2 = pGVar4->Count;
  lVar11 = (long)((pGVar4->Offset % iVar2 + iVar2) % iVar2) * (long)pGVar4->Stride;
  iVar2 = *(int *)((long)pGVar4->Ys + lVar11);
  dVar8 = log10((double)*(int *)((long)pGVar4->Xs + lVar11) /
                (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar3 = pIVar9->CurrentPlot;
  dVar1 = (pIVar3->XAxis).Range.Min;
  iVar10 = pTVar5->YAxis;
  IVar7.y = (float)(((double)iVar2 - pIVar3->YAxis[iVar10].Range.Min) * pIVar9->My[iVar10] +
                   (double)pIVar9->PixelRange[iVar10].Min.y);
  IVar7.x = (float)((((double)(float)(dVar8 / pIVar9->LogDenX) * ((pIVar3->XAxis).Range.Max - dVar1)
                     + dVar1) - dVar1) * pIVar9->Mx + (double)pIVar9->PixelRange[iVar10].Min.x);
  this->P12 = IVar7;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }